

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexKey.h
# Opt level: O2

void __thiscall
UnifiedRegex::RegexKey::RegexKey(RegexKey *this,char16 *source,int length,RegexFlags flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&this->source,source);
  this->length = length;
  this->flags = flags;
  if (source == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/RegexKey.h"
                       ,0x1a,"(source)","source");
    if (!bVar2) goto LAB_00be18ee;
    *puVar3 = 0;
  }
  if (length < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/RegexKey.h"
                       ,0x1b,"(length >= 0)","length >= 0");
    if (!bVar2) {
LAB_00be18ee:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

RegexKey(const char16 *const source, const int length, const RegexFlags flags)
            : source(source), length(length), flags(flags)
        {
            Assert(source);
            Assert(length >= 0);
        }